

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::getp_getJulianDay(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  vm_obj_id_t vVar3;
  long lVar4;
  bignum_t<32> jday;
  bignum_t<32> result_1;
  caldate_t cd;
  bignum_t<32> result;
  bignum_t<32> jt;
  bignum_t<32> local_b0;
  char local_9a [4];
  undefined1 local_96;
  caldate_t local_84;
  undefined8 local_78 [3];
  undefined2 local_60;
  undefined2 uStack_5e;
  uint uStack_5c;
  char local_46 [4];
  undefined1 local_42;
  
  if (oargc == (uint *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (long)(int)*oargc;
  }
  if (getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getJulianDay();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getJulianDay::desc);
  if (iVar1 == 0) {
    caldate_t::set_dayno(&local_84,*(int32_t *)(this->super_CVmObject).ext_);
    iVar2 = caldate_t::dayno(&local_84);
    local_b0.ext[0] = ' ';
    local_b0.ext[1] = '\0';
    local_b0.ext[4] = '\0';
    CVmObjBigNum::set_double_val(local_b0.ext,(double)iVar2 + 1721119.5);
    local_46[0] = ' ';
    local_46[1] = '\0';
    local_42 = 0;
    CVmObjBigNum::set_int_val(local_46,(long)*(int *)((this->super_CVmObject).ext_ + 4));
    local_9a[0] = ' ';
    local_9a[1] = '\0';
    local_96 = 0;
    CVmObjBigNum::set_int_val(local_9a,86400000);
    local_60 = 0x20;
    uStack_5c = uStack_5c & 0xffffff00;
    CVmObjBigNum::compute_quotient_into((char *)&local_60,(char *)0x0,local_46,local_9a);
    local_78[0] = CONCAT44(uStack_5c,CONCAT22(uStack_5e,local_60));
    local_9a[0] = ' ';
    local_9a[1] = '\0';
    local_96 = 0;
    CVmObjBigNum::compute_sum_into(local_9a,local_b0.ext,(char *)local_78);
    CVmObjBigNum::copy_val(local_b0.ext,local_9a,1);
    vVar3 = CVmObjBigNum::create<32>(0,&local_b0);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    sp_ = sp_ + -lVar4;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getJulianDay(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the Julian day number for midnight UTC on my day number */
    caldate_t cd(get_ext()->dayno);
    bignum_t<32> jday(cd.julian_dayno());

    /* add my fraction of a day past midnight UTC */
    bignum_t<32> jt((long)get_ext()->daytime);
    jday += jt / (long)(24*60*60*1000);

    /* return a BigNumber result */
    retval->set_obj(CVmObjBigNum::create(vmg_ FALSE, &jday));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}